

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

UInt32 crnlib::Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit_00;
  UInt32 UVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  UInt32 UVar7;
  UInt32 *pUVar8;
  UInt32 temp;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hashValue;
  UInt32 lenLimit;
  UInt32 offset;
  UInt32 maxLen;
  UInt32 delta3;
  UInt32 delta2;
  UInt32 hash3Value;
  UInt32 hash2Value;
  UInt32 *distances_local;
  CMatchFinder *p_local;
  
  lenLimit_00 = p->lenLimit;
  if (lenLimit_00 < 4) {
    MatchFinder_MovePos(p);
    p_local._4_4_ = 0;
  }
  else {
    pbVar2 = p->buffer;
    uVar3 = p->crc[*pbVar2] ^ (uint)pbVar2[1];
    uVar4 = (uVar3 ^ (uint)pbVar2[2] << 8) & 0xffff;
    uVar5 = (uVar3 ^ (uint)pbVar2[2] << 8 ^ p->crc[pbVar2[3]] << 5) & p->hashMask;
    maxLen = p->pos - p->hash[uVar3 & 0x3ff];
    uVar6 = p->pos - p->hash[uVar4 + 0x400];
    UVar7 = p->hash[uVar5 + 0x10400];
    UVar1 = p->pos;
    p->hash[uVar5 + 0x10400] = UVar1;
    p->hash[uVar4 + 0x400] = UVar1;
    p->hash[uVar3 & 0x3ff] = UVar1;
    lenLimit = 1;
    hashValue = 0;
    if ((maxLen < p->cyclicBufferSize) && (pbVar2[-(ulong)maxLen] == *pbVar2)) {
      lenLimit = 2;
      *distances = 2;
      distances[1] = maxLen - 1;
      hashValue = 2;
    }
    if (((maxLen != uVar6) && (uVar6 < p->cyclicBufferSize)) && (pbVar2[-(ulong)uVar6] == *pbVar2))
    {
      lenLimit = 3;
      distances[hashValue + 1] = uVar6 - 1;
      hashValue = hashValue + 2;
      maxLen = uVar6;
    }
    if (hashValue != 0) {
      for (; (lenLimit != lenLimit_00 &&
             (pbVar2[(ulong)lenLimit - (ulong)maxLen] == pbVar2[lenLimit])); lenLimit = lenLimit + 1
          ) {
      }
      distances[hashValue - 2] = lenLimit;
      if (lenLimit == lenLimit_00) {
        SkipMatchesSpec(lenLimit_00,UVar7,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                        p->cyclicBufferSize,p->cutValue);
        p->cyclicBufferPos = p->cyclicBufferPos + 1;
        p->buffer = p->buffer + 1;
        UVar7 = p->pos + 1;
        p->pos = UVar7;
        if (UVar7 == p->posLimit) {
          MatchFinder_CheckLimits(p);
        }
        return hashValue;
      }
    }
    if (lenLimit < 3) {
      lenLimit = 3;
    }
    pUVar8 = GetMatchesSpec1(lenLimit_00,UVar7,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                             p->cyclicBufferSize,p->cutValue,distances + hashValue,lenLimit);
    p_local._4_4_ = (UInt32)((long)pUVar8 - (long)distances >> 2);
    p->cyclicBufferPos = p->cyclicBufferPos + 1;
    p->buffer = p->buffer + 1;
    UVar7 = p->pos + 1;
    p->pos = UVar7;
    if (UVar7 == p->posLimit) {
      MatchFinder_CheckLimits(p);
    }
  }
  return p_local._4_4_;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, hash3Value, delta2, delta3, maxLen, offset;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  delta3 = p->pos - p->hash[kFix3HashSize + hash3Value];
  curMatch = p->hash[kFix4HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hash3Value] =
          p->hash[kFix4HashSize + hashValue] = p->pos;

  maxLen = 1;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    distances[0] = maxLen = 2;
    distances[1] = delta2 - 1;
    offset = 2;
  }
  if (delta2 != delta3 && delta3 < p->cyclicBufferSize && *(cur - delta3) == *cur) {
    maxLen = 3;
    distances[offset + 1] = delta3 - 1;
    offset += 2;
    delta2 = delta3;
  }
  if (offset != 0) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  if (maxLen < 3)
    maxLen = 3;
  GET_MATCHES_FOOTER(offset, maxLen)
}